

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::clara::detail::Parser::writeToStream(Parser *this,ostream *os)

{
  pointer pAVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  ulong uVar6;
  Column *pCVar7;
  ostream *poVar8;
  HelpColumns *cols;
  pointer pHVar9;
  size_t newWidth;
  ulong uVar10;
  pointer pAVar11;
  Column local_108;
  vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_> rows
  ;
  Columns local_c0;
  Columns row;
  Column local_90;
  Column local_60;
  
  ExeName::name_abi_cxx11_((string *)&local_108,&this->m_exeName);
  ::std::__cxx11::string::~string((string *)&local_108);
  if (local_108.m_strings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    poVar5 = ::std::operator<<((ostream *)os,"usage:\n");
    poVar5 = ::std::operator<<(poVar5,"  ");
    ExeName::name_abi_cxx11_((string *)&local_108,&this->m_exeName);
    poVar5 = ::std::operator<<(poVar5,(string *)&local_108);
    ::std::operator<<(poVar5," ");
    ::std::__cxx11::string::~string((string *)&local_108);
    pAVar1 = (this->m_args).
             super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar3 = true;
    bVar2 = true;
    for (pAVar11 = (this->m_args).
                   super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
                   ._M_impl.super__Vector_impl_data._M_start; pAVar11 != pAVar1;
        pAVar11 = pAVar11 + 1) {
      if (!bVar3) {
        ::std::operator<<((ostream *)os," ");
      }
      if (((pAVar11->super_ParserRefImpl<Catch::clara::detail::Arg>).m_optionality == Optional) &&
         (bVar2)) {
        ::std::operator<<((ostream *)os,"[");
        bVar2 = false;
      }
      poVar5 = ::std::operator<<((ostream *)os,"<");
      ::std::__cxx11::string::string
                ((string *)&local_108,
                 &(pAVar11->super_ParserRefImpl<Catch::clara::detail::Arg>).m_hint);
      poVar5 = ::std::operator<<(poVar5,(string *)&local_108);
      ::std::operator<<(poVar5,">");
      ::std::__cxx11::string::~string((string *)&local_108);
      iVar4 = (*(pAVar11->super_ParserRefImpl<Catch::clara::detail::Arg>).
                super_ComposableParserImpl<Catch::clara::detail::Arg>.super_ParserBase.
                _vptr_ParserBase[4])(pAVar11);
      if (CONCAT44(extraout_var,iVar4) == 0) {
        ::std::operator<<((ostream *)os," ... ");
      }
      bVar3 = false;
    }
    if (!bVar2) {
      ::std::operator<<((ostream *)os,"]");
    }
    if ((this->m_options).
        super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (this->m_options).
        super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      ::std::operator<<((ostream *)os," options");
    }
    poVar5 = ::std::operator<<((ostream *)os,"\n\nwhere options are:");
    ::std::endl<char,std::char_traits<char>>(poVar5);
  }
  getHelpColumns(&rows,this);
  uVar6 = 0;
  for (pHVar9 = rows.
                super__Vector_base<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pHVar9 != rows.
                super__Vector_base<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
                ._M_impl.super__Vector_impl_data._M_finish; pHVar9 = pHVar9 + 1) {
    uVar10 = (pHVar9->left)._M_string_length + 2;
    if (uVar6 <= uVar10) {
      uVar6 = uVar10;
    }
  }
  newWidth = 0x28;
  if (uVar6 < 0x28) {
    newWidth = uVar6;
  }
  for (pHVar9 = rows.
                super__Vector_base<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pHVar9 != rows.
                super__Vector_base<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
                ._M_impl.super__Vector_impl_data._M_finish; pHVar9 = pHVar9 + 1) {
    TextFlow::Column::Column(&local_108,&pHVar9->left);
    pCVar7 = TextFlow::Column::width(&local_108,newWidth);
    pCVar7->m_indent = 2;
    TextFlow::Spacer::Spacer((Spacer *)&local_90,4);
    TextFlow::Column::operator+(&local_c0,pCVar7,&local_90);
    TextFlow::Column::Column(&local_60,&pHVar9->right);
    pCVar7 = TextFlow::Column::width(&local_60,0x49 - newWidth);
    TextFlow::Columns::operator+(&row,&local_c0,pCVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_60.m_strings);
    std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>::
    ~vector(&local_c0.m_columns);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_90.m_strings);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_108.m_strings);
    poVar8 = TextFlow::operator<<(os,&row);
    ::std::endl<char,std::char_traits<char>>((ostream *)poVar8);
    std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>::
    ~vector(&row.m_columns);
  }
  std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
  ::~vector(&rows);
  return;
}

Assistant:

void writeToStream( std::ostream &os ) const {
            if (!m_exeName.name().empty()) {
                os << "usage:\n" << "  " << m_exeName.name() << " ";
                bool required = true, first = true;
                for( auto const &arg : m_args ) {
                    if (first)
                        first = false;
                    else
                        os << " ";
                    if( arg.isOptional() && required ) {
                        os << "[";
                        required = false;
                    }
                    os << "<" << arg.hint() << ">";
                    if( arg.cardinality() == 0 )
                        os << " ... ";
                }
                if( !required )
                    os << "]";
                if( !m_options.empty() )
                    os << " options";
                os << "\n\nwhere options are:" << std::endl;
            }

            auto rows = getHelpColumns();
            size_t consoleWidth = CATCH_CLARA_CONFIG_CONSOLE_WIDTH;
            size_t optWidth = 0;
            for( auto const &cols : rows )
                optWidth = (std::max)(optWidth, cols.left.size() + 2);

            optWidth = (std::min)(optWidth, consoleWidth/2);

            for( auto const &cols : rows ) {
                auto row =
                        TextFlow::Column( cols.left ).width( optWidth ).indent( 2 ) +
                        TextFlow::Spacer(4) +
                        TextFlow::Column( cols.right ).width( consoleWidth - 7 - optWidth );
                os << row << std::endl;
            }
        }